

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

MemberSyntax * __thiscall
slang::parsing::Parser::parseVariableDeclaration(Parser *this,AttrList attributes)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_00;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> elements_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_02;
  Token semi_00;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements_03;
  Token name_00;
  Token typedefKeyword_00;
  Token identifier_00;
  Token semi_01;
  Token let_00;
  Token name_01;
  Token semi_02;
  Token equals_00;
  Token semi_03;
  AttrList attributes_00;
  bool bVar1;
  ForwardTypeRestrictionSyntax *pFVar2;
  ForwardTypedefDeclarationSyntax *pFVar3;
  TypedefDeclarationSyntax *pTVar4;
  ExpressionSyntax *pEVar5;
  NetTypeDeclarationSyntax *pNVar6;
  DataDeclarationSyntax *pDVar7;
  Parser *in_RDI;
  bool bVar8;
  Token TVar9;
  Token TVar10;
  Token *in_stack_00000050;
  Parser *in_stack_00000058;
  undefined1 in_stack_00000060 [16];
  ExpressionSyntax *expr;
  Token equals;
  AssertionItemPortListSyntax *portList;
  Token identifier;
  Token let;
  Parser *in_stack_000001c8;
  AttrList in_stack_000001d0;
  ParameterDeclarationBaseSyntax *parameter;
  Token semi;
  span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL> dims;
  Token name;
  DataTypeSyntax *type;
  Token name_1;
  ForwardTypeRestrictionSyntax *restriction;
  Token typedefKeyword;
  ParserBase *in_stack_fffffffffffffc28;
  Parser *in_stack_fffffffffffffc30;
  undefined6 in_stack_fffffffffffffc38;
  TokenKind in_stack_fffffffffffffc3e;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffc40;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffc48;
  ParserBase *in_stack_fffffffffffffc50;
  Info *in_stack_fffffffffffffc58;
  Info *in_stack_fffffffffffffc60;
  Info *pIVar11;
  Info *in_stack_fffffffffffffc68;
  Info *in_stack_fffffffffffffc70;
  AssertionItemPortListSyntax *in_stack_fffffffffffffc80;
  DataTypeSyntax *pDVar12;
  Info *in_stack_fffffffffffffc88;
  Info *in_stack_fffffffffffffc90;
  undefined6 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9e;
  undefined1 in_stack_fffffffffffffc9f;
  undefined6 in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb8;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcd0;
  undefined1 isExpected;
  Parser *in_stack_fffffffffffffcd8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_320;
  Info *local_318;
  Parser *in_stack_fffffffffffffd40;
  AttrList in_stack_fffffffffffffd48;
  Parser *in_stack_fffffffffffffe00;
  pointer in_stack_fffffffffffffe08;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe10;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *local_1d8;
  Info *local_1d0;
  bitmask<slang::parsing::detail::TypeOptions> local_f4;
  DataTypeSyntax *local_f0;
  Token local_e8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_d8;
  Info *local_d0;
  undefined8 local_c8;
  Info *local_c0;
  Token local_70;
  Token in_stack_ffffffffffffffa0;
  undefined8 local_48;
  Info *local_40;
  TokenKind local_38;
  PackageImportDeclarationSyntax *local_10;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffcb8 >> 0x30);
  isExpected = (undefined1)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  TVar9 = ParserBase::peek(in_stack_fffffffffffffc28);
  local_38 = TVar9.kind;
  if (local_38 == ImportKeyword) {
    attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffe10._M_extent_value;
    attributes_00._M_ptr = in_stack_fffffffffffffe08;
    local_10 = parseImportDeclaration(in_stack_fffffffffffffe00,attributes_00);
  }
  else if (local_38 == LetKeyword) {
    TVar9 = ParserBase::consume(in_stack_fffffffffffffc50);
    TVar10 = ParserBase::expect(in_stack_fffffffffffffcc0,kind);
    parseAssertionItemPortList(TVar9._0_8_,TVar10.info._4_4_);
    ParserBase::expect(in_stack_fffffffffffffcc0,kind);
    pEVar5 = parseExpression(in_stack_fffffffffffffc30);
    pIVar11 = (Info *)&in_RDI->factory;
    elements_03._M_ptr._6_2_ = in_stack_fffffffffffffc3e;
    elements_03._M_ptr._0_6_ = in_stack_fffffffffffffc38;
    elements_03._M_extent._M_extent_value = in_stack_fffffffffffffc40._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffc30,
               elements_03);
    TVar9 = ParserBase::expect(in_stack_fffffffffffffcc0,kind);
    local_320 = TVar9._0_8_;
    local_318 = TVar9.info;
    let_00.info = in_stack_fffffffffffffc70;
    let_00._0_8_ = pEVar5;
    identifier_00.info = pIVar11;
    identifier_00._0_8_ = in_stack_fffffffffffffc58;
    equals_00.info = in_stack_fffffffffffffc90;
    equals_00._0_8_ = in_stack_fffffffffffffc88;
    semi_03.info._0_6_ = in_stack_fffffffffffffca8;
    semi_03._0_8_ = in_RDI;
    semi_03.info._6_2_ = local_38;
    local_10 = (PackageImportDeclarationSyntax *)
               slang::syntax::SyntaxFactory::letDeclaration
                         ((SyntaxFactory *)local_318,local_320,let_00,identifier_00,
                          in_stack_fffffffffffffc80,equals_00,
                          (ExpressionSyntax *)
                          CONCAT17(in_stack_fffffffffffffc9f,
                                   CONCAT16(in_stack_fffffffffffffc9e,in_stack_fffffffffffffc98)),
                          semi_03);
  }
  else {
    if (local_38 != LocalParamKeyword) {
      if (local_38 == NetTypeKeyword) {
        pNVar6 = parseNetTypeDecl(in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
        return &pNVar6->super_MemberSyntax;
      }
      if (local_38 != ParameterKeyword) {
        if (local_38 != TypedefKeyword) {
          pDVar7 = parseDataDeclaration(in_stack_000001c8,in_stack_000001d0);
          return &pDVar7->super_MemberSyntax;
        }
        TVar9 = ParserBase::consume(in_stack_fffffffffffffc50);
        pFVar2 = parseTypeRestriction(in_stack_fffffffffffffcd8,(bool)isExpected);
        bVar8 = true;
        if (pFVar2 == (ForwardTypeRestrictionSyntax *)0x0) {
          bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffc40._M_extent_value,
                                   in_stack_fffffffffffffc3e);
          bVar8 = false;
          if (bVar1) {
            in_stack_ffffffffffffffa0 =
                 ParserBase::peek((ParserBase *)
                                  CONCAT26(in_stack_fffffffffffffc3e,in_stack_fffffffffffffc38),
                                  (uint32_t)((ulong)in_stack_fffffffffffffc30 >> 0x20));
            bVar8 = in_stack_ffffffffffffffa0.kind == Semicolon;
          }
        }
        local_48 = TVar9._0_8_;
        local_40 = TVar9.info;
        if (!bVar8) {
          memset(&local_f4,0,4);
          bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_f4);
          local_f0 = parseDataType(in_stack_ffffffffffffffa0._0_8_,
                                   (bitmask<slang::parsing::detail::TypeOptions>)
                                   in_stack_ffffffffffffffa0.info._4_4_);
          ParserBase::expect(in_stack_fffffffffffffcc0,kind);
          parseDimensionList(in_RDI);
          pIVar11 = (Info *)&in_RDI->factory;
          elements_00._M_ptr._6_2_ = in_stack_fffffffffffffc3e;
          elements_00._M_ptr._0_6_ = in_stack_fffffffffffffc38;
          elements_00._M_extent._M_extent_value = in_stack_fffffffffffffc40._M_extent_value;
          slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                    ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffc30
                     ,elements_00);
          elements_01._M_ptr._6_2_ = in_stack_fffffffffffffc3e;
          elements_01._M_ptr._0_6_ = in_stack_fffffffffffffc38;
          elements_01._M_extent._M_extent_value = in_stack_fffffffffffffc40._M_extent_value;
          pDVar12 = local_f0;
          slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>::SyntaxList
                    ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_fffffffffffffc30
                     ,elements_01);
          TVar9 = ParserBase::expect(in_stack_fffffffffffffcc0,kind);
          local_1d8 = TVar9._0_8_;
          local_1d0 = TVar9.info;
          typedefKeyword_00.info = in_stack_fffffffffffffc60;
          typedefKeyword_00._0_8_ = in_stack_fffffffffffffc58;
          name_01.info = pIVar11;
          name_01._0_8_ = in_stack_fffffffffffffc70;
          semi_02.info = in_stack_fffffffffffffc88;
          semi_02._0_8_ = pDVar12;
          pTVar4 = slang::syntax::SyntaxFactory::typedefDeclaration
                             ((SyntaxFactory *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                              typedefKeyword_00,(DataTypeSyntax *)local_1d0,name_01,local_1d8,
                              semi_02);
          return &pTVar4->super_MemberSyntax;
        }
        local_70 = ParserBase::expect(in_stack_fffffffffffffcc0,kind);
        elements._M_ptr._6_2_ = in_stack_fffffffffffffc3e;
        elements._M_ptr._0_6_ = in_stack_fffffffffffffc38;
        elements._M_extent._M_extent_value = in_stack_fffffffffffffc40._M_extent_value;
        slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                  ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffc30,
                   elements);
        local_c8 = local_48;
        local_c0 = local_40;
        local_d8 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_70._0_8_;
        local_d0 = local_70.info;
        local_e8 = ParserBase::expect(in_stack_fffffffffffffcc0,kind);
        name_00.info = in_stack_fffffffffffffc58;
        name_00._0_8_ = in_stack_fffffffffffffc50;
        semi_01.info = in_stack_fffffffffffffc68;
        semi_01._0_8_ = in_stack_fffffffffffffc60;
        pFVar3 = slang::syntax::SyntaxFactory::forwardTypedefDeclaration
                           ((SyntaxFactory *)local_d0,local_d8,local_e8,
                            (ForwardTypeRestrictionSyntax *)0xbdddbe,name_00,semi_01);
        return &pFVar3->super_MemberSyntax;
      }
    }
    Token::Token((Token *)in_stack_fffffffffffffc30);
    ParserBase::consume(in_stack_fffffffffffffc50);
    parseParameterDecl(in_stack_00000058,(Token)in_stack_00000060,in_stack_00000050);
    elements_02._M_ptr._6_2_ = in_stack_fffffffffffffc3e;
    elements_02._M_ptr._0_6_ = in_stack_fffffffffffffc38;
    elements_02._M_extent._M_extent_value = in_stack_fffffffffffffc40._M_extent_value;
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_stack_fffffffffffffc30,
               elements_02);
    semi_00.rawLen._2_2_ = in_stack_fffffffffffffc3e;
    semi_00._0_6_ = in_stack_fffffffffffffc38;
    semi_00.info = (Info *)in_stack_fffffffffffffc40._M_extent_value;
    local_10 = (PackageImportDeclarationSyntax *)
               slang::syntax::SyntaxFactory::parameterDeclarationStatement
                         ((SyntaxFactory *)in_stack_fffffffffffffc30,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                          in_stack_fffffffffffffc28,(ParameterDeclarationBaseSyntax *)0xbde08f,
                          semi_00);
  }
  return &local_10->super_MemberSyntax;
}

Assistant:

MemberSyntax& Parser::parseVariableDeclaration(AttrList attributes) {
    switch (peek().kind) {
        case TokenKind::TypedefKeyword: {
            auto typedefKeyword = consume();
            auto restriction = parseTypeRestriction(/* isExpected */ false);
            if (restriction ||
                (peek(TokenKind::Identifier) && peek(1).kind == TokenKind::Semicolon)) {
                auto name = expect(TokenKind::Identifier);
                return factory.forwardTypedefDeclaration(attributes, typedefKeyword, restriction,
                                                         name, expect(TokenKind::Semicolon));
            }

            auto& type = parseDataType();
            auto name = expect(TokenKind::Identifier);
            auto dims = parseDimensionList();
            return factory.typedefDeclaration(attributes, typedefKeyword, type, name, dims,
                                              expect(TokenKind::Semicolon));
        }
        case TokenKind::ParameterKeyword:
        case TokenKind::LocalParamKeyword: {
            Token semi;
            auto& parameter = parseParameterDecl(consume(), &semi);
            return factory.parameterDeclarationStatement(attributes, parameter, semi);
        }
        case TokenKind::LetKeyword: {
            auto let = consume();
            auto identifier = expect(TokenKind::Identifier);
            auto portList = parseAssertionItemPortList(SyntaxKind::LetDeclaration);
            auto equals = expect(TokenKind::Equals);
            auto& expr = parseExpression();
            return factory.letDeclaration(attributes, let, identifier, portList, equals, expr,
                                          expect(TokenKind::Semicolon));
        }
        case TokenKind::ImportKeyword:
            return parseImportDeclaration(attributes);
        case TokenKind::NetTypeKeyword:
            return parseNetTypeDecl(attributes);
        default:
            return parseDataDeclaration(attributes);
    }
}